

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O2

string * gimage::anon_unknown_17::getTileName
                   (string *__return_storage_ptr__,string *prefix,int trow,int tcol,string *suffix)

{
  long lVar1;
  ostream *poVar2;
  ostringstream ret;
  undefined8 uStack_198;
  uint auStack_190 [50];
  undefined1 auStack_c8 [152];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ret);
  lVar1 = *(long *)(_ret + -0x18);
  std::ios::fill();
  auStack_c8[lVar1] = 0x30;
  *(uint *)((long)auStack_190 + *(long *)(_ret + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(_ret + -0x18)) & 0xffffff4f | 0x80;
  poVar2 = std::operator<<((ostream *)&ret,(string *)prefix);
  std::operator<<(poVar2,'_');
  *(undefined8 *)((long)&uStack_198 + *(long *)(_ret + -0x18)) = 2;
  std::ostream::operator<<(&ret,trow);
  *(undefined8 *)((long)&uStack_198 + *(long *)(_ret + -0x18)) = 0;
  std::operator<<((ostream *)&ret,'_');
  *(undefined8 *)((long)&uStack_198 + *(long *)(_ret + -0x18)) = 2;
  std::ostream::operator<<(&ret,tcol);
  *(undefined8 *)((long)&uStack_198 + *(long *)(_ret + -0x18)) = 0;
  poVar2 = std::operator<<((ostream *)&ret,'_');
  std::operator<<(poVar2,(string *)suffix);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ret);
  return __return_storage_ptr__;
}

Assistant:

std::string getTileName(const std::string &prefix, int trow, int tcol, const std::string &suffix)
{
  std::ostringstream ret;

  ret.fill('0');
  ret << std::right;

  ret << prefix << '_';

  ret.width(2);
  ret << trow;
  ret.width(0);
  ret << '_';
  ret.width(2);
  ret << tcol;
  ret.width(0);

  ret << '_' << suffix;

  return ret.str();
}